

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::AdvancedChangeSize::Cleanup(AdvancedChangeSize *this)

{
  CallLogWrapper *this_00;
  int i;
  long lVar1;
  
  this_00 = &(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glDeleteProgramPipelines(this_00,1,&this->m_pipeline);
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    glu::CallLogWrapper::glDeleteProgram(this_00,this->m_program[lVar1]);
  }
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&this->m_vertex_array);
  glu::CallLogWrapper::glDeleteTextures(this_00,2,this->m_texture);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glDeleteProgramPipelines(1, &m_pipeline);
		for (int i = 0; i < 2; ++i)
			glDeleteProgram(m_program[i]);
		glDeleteVertexArrays(1, &m_vertex_array);
		glDeleteTextures(2, m_texture);
		return NO_ERROR;
	}